

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldsWithPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UVector *patternItems,
          UBool forceSingleHourDigit,int32_t *hour,int32_t *min,int32_t *sec)

{
  short sVar1;
  int iVar2;
  UBool UVar3;
  int8_t iVar4;
  int _length;
  UChar32 c;
  void *pvVar5;
  int iVar6;
  int32_t iVar7;
  UChar *s;
  int index;
  uint c_00;
  int32_t local_70;
  int32_t local_6c;
  int32_t local_68;
  int32_t local_64;
  TimeZoneFormat *local_60;
  int32_t local_54;
  uint local_50;
  int32_t local_4c;
  int32_t *local_48;
  UVector *local_40;
  UnicodeString *local_38;
  
  local_50 = (uint)(byte)((forceSingleHourDigit == '\0') + 1);
  local_64 = 0;
  local_68 = 0;
  local_6c = 0;
  local_60 = this;
  local_54 = start;
  local_48 = hour;
  local_40 = patternItems;
  local_38 = text;
  for (index = 0; iVar2 = patternItems->count, index < iVar2; index = index + 1) {
    local_70 = 0;
    pvVar5 = UVector::elementAt(patternItems,index);
    switch(*(undefined4 *)((long)pvVar5 + 0x10)) {
    case 0:
      s = *(UChar **)((long)pvVar5 + 8);
      _length = u_strlen_63(s);
      local_4c = start;
      if (index == 0) {
        sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (text->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        if (start < iVar6) {
          c = UnicodeString::char32At(text,start);
          UVar3 = PatternProps::isWhiteSpace(c);
          iVar7 = _length;
          if (UVar3 == '\0') {
            do {
              _length = iVar7;
              if (_length < 1) break;
              c_00 = (uint)(ushort)*s;
              if (((((c_00 & 0xf800) == 0xd800) && (((ushort)*s >> 10 & 1) == 0)) && (_length != 1))
                 && (((ushort)s[1] & 0xfc00) == 0xdc00)) {
                c_00 = c_00 * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
              }
              UVar3 = PatternProps::isWhiteSpace(c_00);
              iVar6 = 2 - (uint)(c_00 < 0x10000);
              iVar7 = _length - iVar6;
              if (UVar3 == '\0') {
                iVar6 = 0;
              }
              s = (UChar *)((long)s + (ulong)(uint)(iVar6 * 2));
            } while (UVar3 != '\0');
          }
        }
      }
      text = local_38;
      start = local_4c;
      iVar4 = UnicodeString::caseCompare(local_38,local_4c,_length,s,0);
      patternItems = local_40;
      if (iVar4 == '\0') goto LAB_002067fa;
      if (index < iVar2) goto switchD_00206665_caseD_3;
      goto LAB_0020682c;
    case 1:
      local_6c = parseOffsetFieldWithLocalizedDigits
                           (local_60,text,start,'\x01',(uint8_t)local_50,0,0x17,&local_70);
      break;
    case 2:
      local_68 = parseOffsetFieldWithLocalizedDigits
                           (local_60,text,start,'\x02','\x02',0,0x3b,&local_70);
      break;
    default:
      goto switchD_00206665_caseD_3;
    case 4:
      local_64 = parseOffsetFieldWithLocalizedDigits
                           (local_60,text,start,'\x02','\x02',0,0x3b,&local_70);
    }
    _length = local_70;
    if (local_70 == 0) {
switchD_00206665_caseD_3:
      *sec = 0;
      *min = 0;
      *local_48 = 0;
      return 0;
    }
LAB_002067fa:
    start = start + _length;
  }
LAB_0020682c:
  *local_48 = local_6c;
  *min = local_68;
  *sec = local_64;
  return start - local_54;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldsWithPattern(const UnicodeString& text, int32_t start,
        UVector* patternItems, UBool forceSingleHourDigit, int32_t& hour, int32_t& min, int32_t& sec) const {
    UBool failed = FALSE;
    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;
    int32_t idx = start;

    for (int32_t i = 0; i < patternItems->size(); i++) {
        int32_t len = 0;
        const GMTOffsetField* field = (const GMTOffsetField*)patternItems->elementAt(i);
        GMTOffsetField::FieldType fieldType = field->getType();
        if (fieldType == GMTOffsetField::TEXT) {
            const UChar* patStr = field->getPatternText();
            len = u_strlen(patStr);
            if (i == 0) {
                // When TimeZoneFormat parse() is called from SimpleDateFormat,
                // leading space characters might be truncated. If the first pattern text
                // starts with such character (e.g. Bidi control), then we need to
                // skip the leading space charcters.
                if (idx < text.length() && !PatternProps::isWhiteSpace(text.char32At(idx))) {
                    while (len > 0) {
                        UChar32 ch;
                        int32_t chLen;
                        U16_GET(patStr, 0, 0, len, ch)
                        if (PatternProps::isWhiteSpace(ch)) {
                            chLen = U16_LENGTH(ch);
                            len -= chLen;
                            patStr += chLen;
                        }
                        else {
                            break;
                        }
                    }
                }
            }
            if (text.caseCompare(idx, len, patStr, 0) != 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        } else {
            if (fieldType == GMTOffsetField::HOUR) {
                uint8_t maxDigits = forceSingleHourDigit ? 1 : 2;
                offsetH = parseOffsetFieldWithLocalizedDigits(text, idx, 1, maxDigits, 0, MAX_OFFSET_HOUR, len);
            } else if (fieldType == GMTOffsetField::MINUTE) {
                offsetM = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            } else if (fieldType == GMTOffsetField::SECOND) {
                offsetS = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_SECOND, len);
            }

            if (len == 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        }
    }

    if (failed) {
        hour = min = sec = 0;
        return 0;
    }

    hour = offsetH;
    min = offsetM;
    sec = offsetS;

    return idx - start;
}